

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateSync(zng_stream *strm)

{
  internal_state *piVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  uint32_t uVar5;
  zng_stream *in_RDI;
  uchar buf [4];
  int flags;
  uint len;
  size_t out;
  size_t in;
  inflate_state *state;
  zng_stream *in_stack_ffffffffffffffc8;
  uint local_2c;
  int32_t local_4;
  
  iVar4 = inflateStateCheck(in_RDI);
  if (iVar4 == 0) {
    piVar1 = in_RDI->state;
    if ((in_RDI->avail_in == 0) && (*(uint *)&piVar1->head < 8)) {
      local_4 = -5;
    }
    else {
      if (*(int *)&piVar1->pending_buf != 0x3f52) {
        *(undefined4 *)&piVar1->pending_buf = 0x3f52;
        piVar1->prev = (Pos *)((ulong)piVar1->prev >> ((byte)*(undefined4 *)&piVar1->head & 7));
        *(uint *)&piVar1->head = *(int *)&piVar1->head - (*(uint *)&piVar1->head & 7);
        local_2c = 0;
        while (7 < *(uint *)&piVar1->head) {
          (&stack0xffffffffffffffcc)[local_2c] = (char)piVar1->prev;
          piVar1->prev = (Pos *)((ulong)piVar1->prev >> 8);
          *(int *)&piVar1->head = *(int *)&piVar1->head + -8;
          local_2c = local_2c + 1;
        }
        *(undefined4 *)((long)&piVar1->update_hash + 4) = 0;
        syncsearch((uint32_t *)((long)&piVar1->update_hash + 4),&stack0xffffffffffffffcc,local_2c);
      }
      uVar5 = syncsearch((uint32_t *)((long)&piVar1->update_hash + 4),in_RDI->next_in,
                         in_RDI->avail_in);
      in_RDI->avail_in = in_RDI->avail_in - uVar5;
      in_RDI->next_in = in_RDI->next_in + uVar5;
      in_RDI->total_in = (ulong)uVar5 + in_RDI->total_in;
      if (*(int *)((long)&piVar1->update_hash + 4) == 4) {
        if (piVar1->pending_buf_size == 0xffffffff) {
          *(undefined4 *)&piVar1->pending_out = 0;
        }
        else {
          *(uint *)&piVar1->pending_out = *(uint *)&piVar1->pending_out & 0xfffffffb;
        }
        uVar5 = piVar1->pending_buf_size;
        sVar2 = in_RDI->total_in;
        sVar3 = in_RDI->total_out;
        zng_inflateReset(in_stack_ffffffffffffffc8);
        in_RDI->total_in = sVar2;
        in_RDI->total_out = sVar3;
        piVar1->pending_buf_size = uVar5;
        *(undefined4 *)&piVar1->pending_buf = 0x3f3f;
        local_4 = 0;
      }
      else {
        local_4 = -3;
      }
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateSync)(PREFIX3(stream) *strm) {
    struct inflate_state *state;
    size_t in, out;             /* temporary to save total_in and total_out */
    unsigned len;               /* number of bytes to look at or looked at */
    int flags;                  /* temporary to save header status */
    unsigned char buf[4];       /* to restore bit buffer to byte string */

    /* check parameters */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if (strm->avail_in == 0 && state->bits < 8)
        return Z_BUF_ERROR;

    /* if first time, start search in bit buffer */
    if (state->mode != SYNC) {
        state->mode = SYNC;
        state->hold >>= state->bits & 7;
        state->bits -= state->bits & 7;
        len = 0;
        while (state->bits >= 8) {
            buf[len++] = (unsigned char)(state->hold);
            state->hold >>= 8;
            state->bits -= 8;
        }
        state->have = 0;
        syncsearch(&(state->have), buf, len);
    }

    /* search available input */
    len = syncsearch(&(state->have), strm->next_in, strm->avail_in);
    strm->avail_in -= len;
    strm->next_in += len;
    strm->total_in += len;

    /* return no joy or set up to restart inflate() on a new block */
    if (state->have != 4)
        return Z_DATA_ERROR;
    if (state->flags == -1)
        state->wrap = 0;    /* if no header yet, treat as raw */
    else
        state->wrap &= ~4;  /* no point in computing a check value now */
    flags = state->flags;
    in = strm->total_in;
    out = strm->total_out;
    PREFIX(inflateReset)(strm);
    strm->total_in = (z_uintmax_t)in; /* Can't use z_size_t here as it will overflow on 64-bit Windows */
    strm->total_out = (z_uintmax_t)out;
    state->flags = flags;
    state->mode = TYPE;
    return Z_OK;
}